

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseJacocoCoverage.cxx
# Opt level: O2

void __thiscall cmParseJacocoCoverage::XMLParser::~XMLParser(XMLParser *this)

{
  ~XMLParser(this);
  operator_delete(this,0xd0);
  return;
}

Assistant:

virtual ~XMLParser()
      {
      }